

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::addDualActivity
          (SPxLPBase<double> *this,SVectorBase<double> *dual,VectorBase<double> *activity)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  int __c;
  SPxLPBase<double> *in_RDX;
  SVectorBase<double> *in_RSI;
  VectorBase<double> *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  SPxInternalCodeException *in_stack_ffffffffffffff80;
  SPxLPBase<double> *this_00;
  SVectorBase<double> *in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffff98;
  allocator *paVar4;
  uint local_54;
  allocator local_39;
  string local_38 [32];
  SPxLPBase<double> *local_18;
  SVectorBase<double> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar1 = VectorBase<double>::dim((VectorBase<double> *)0x2099a0);
  iVar2 = nCols((SPxLPBase<double> *)0x2099ae);
  if (iVar1 != iVar2) {
    uVar3 = __cxa_allocate_exception(0x28);
    paVar4 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,"XSPXLP04 Activity vector computing dual activity has wrong dimension",
               paVar4);
    SPxInternalCodeException::SPxInternalCodeException
              (in_stack_ffffffffffffff80,
               (string *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    __cxa_throw(uVar3,&SPxInternalCodeException::typeinfo,
                SPxInternalCodeException::~SPxInternalCodeException);
  }
  local_54 = SVectorBase<double>::size(local_10);
  while (local_54 = local_54 - 1, -1 < (int)local_54) {
    this_00 = local_18;
    SVectorBase<double>::value(local_10,local_54);
    SVectorBase<double>::index(local_10,(char *)(ulong)local_54,__c);
    rowVector(this_00,in_stack_ffffffffffffff7c);
    VectorBase<double>::multAdd<double,double>
              (in_RDI,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  }
  return;
}

Assistant:

virtual void addDualActivity(const SVectorBase<R>& dual, VectorBase<R>& activity) const
   {
      if(activity.dim() != nCols())
      {
         throw SPxInternalCodeException("XSPXLP04 Activity vector computing dual activity has wrong dimension");
      }

      for(int i = dual.size() - 1; i >= 0; i--)
      {
         assert(dual.index(i) >= 0);
         assert(dual.index(i) < nRows());
         activity.multAdd(dual.value(i), rowVector(dual.index(i)));
      }
   }